

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

StringRef llvm::sys::path::root_name(StringRef path,Style style)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  Style in_R8D;
  bool bVar4;
  bool bVar5;
  StringRef SVar6;
  StringRef path_00;
  const_iterator b;
  const_iterator local_50;
  
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)path.Length;
  path_00.Length._4_4_ = 0;
  begin(&local_50,(path *)path.Data,path_00,in_R8D);
  if ((path *)local_50.Path.Data == (path *)path.Data) {
    pcVar2 = (char *)0x0;
    pcVar3 = (char *)0x0;
    if (local_50.Position == path.Length) goto LAB_0017652d;
  }
  if ((local_50.Component.Length < (char *)0x3) ||
     ((cVar1 = *local_50.Component.Data, cVar1 != '/' && (cVar1 != '\\' || style != windows)))) {
    bVar4 = false;
  }
  else {
    bVar4 = local_50.Component.Data[1] == cVar1;
  }
  if ((char *)local_50.Component.Length == (char *)0x0 || style != windows) {
    bVar5 = false;
  }
  else {
    bVar5 = (local_50.Component.Data + -1)[local_50.Component.Length] == ':';
  }
  pcVar2 = local_50.Component.Data;
  pcVar3 = (char *)local_50.Component.Length;
  if (!bVar4 && !bVar5) {
    pcVar2 = (char *)0x0;
    pcVar3 = (char *)0x0;
  }
LAB_0017652d:
  SVar6.Length = (size_t)pcVar3;
  SVar6.Data = pcVar2;
  return SVar6;
}

Assistant:

StringRef root_name(StringRef path, Style style) {
  const_iterator b = begin(path, style), e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if (has_net || has_drive) {
      // just {C:,//net}, return the first component.
      return *b;
    }
  }

  // No path or no name.
  return StringRef();
}